

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O2

int __thiscall dic::dictDelete(dic *this,int dictidx,void *key)

{
  int iVar1;
  string *this_00;
  rlist *this_01;
  undefined8 *puVar2;
  void *pvVar3;
  long lVar4;
  
  iVar1 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.super__Vector_impl_data
          ._M_start[dictidx].rehashidx;
  puVar2 = (undefined8 *)dict_find(this,dictidx,0,key);
  if (iVar1 == -1) {
    if (puVar2 != (undefined8 *)0x0) {
      this_00 = (string *)*puVar2;
      if (this_00 != (string *)0x0) {
        std::__cxx11::string::~string(this_00);
      }
      operator_delete(this_00);
      *puVar2 = 0;
      this_01 = (rlist *)puVar2[1];
      iVar1 = *(int *)&this_01->rl;
      if (iVar1 == 2) {
        if (this_01[-1].view != (listNode *)0x0) {
          lVar4 = (long)this_01[-1].view << 5;
          do {
            std::__cxx11::string::~string((string *)((long)this_01 + lVar4 + -0x20));
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != 0);
        }
        operator_delete__(&this_01[-1].view);
      }
      else if (iVar1 == 1) {
        rlist::listDel(this_01);
      }
      else if (iVar1 == 0) {
        std::__cxx11::string::~string((string *)this_01);
        operator_delete(this_01);
      }
      goto LAB_0010897b;
    }
  }
  else {
    if (puVar2 != (undefined8 *)0x0) {
LAB_0010897b:
      operator_delete(puVar2);
      return 1;
    }
    pvVar3 = dict_find(this,dictidx,1,key);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
      return 1;
    }
  }
  return -1;
}

Assistant:

int dic::dictDelete(int dictidx,void *key){
    dictEntry *delEntry=NULL;
    if(dc[dictidx].rehashidx==-1){
        delEntry=(dictEntry *)dic::dict_find(dictidx,0,key);
        if(delEntry!=NULL){
            delete (std::string *)delEntry->key;
            delEntry->key=NULL;
            if(((robj *)delEntry->v.val)->objtype==_string)
            {
                delete (std::string *)delEntry->v.val;
            }else if(((robj *)delEntry->v.val)->objtype==_set){
                delete[] (std::string *)delEntry->v.val; 
            }else if(((robj *)delEntry->v.val)->objtype==_list){
                ((rlist *)delEntry->v.val)->listDel();
            }
            delEntry->v.val=NULL;
            delete delEntry;
            delEntry=NULL;
            return 1;
        }
    }else {
        delEntry=(dictEntry *)dic::dict_find(dictidx,0,key);
        if(delEntry!=NULL){
            delete delEntry;
            delEntry=NULL;
            return 1;
        }
        else if((delEntry=(dictEntry *)dic::dict_find(dictidx,1,key))!=NULL){
            if(delEntry!=NULL){
                delete delEntry;
                delEntry=NULL;
                return 1;
            } 
        }  
    }
    return -1;
}